

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O0

size_type __thiscall
lf::mesh::hybrid2d::MeshFactory::AddPoint
          (MeshFactory *this,
          unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry
          )

{
  bool bVar1;
  RefElType RVar2;
  RefElType RVar3;
  dim_t dVar4;
  int iVar5;
  pointer pGVar6;
  size_type sVar7;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  string local_6b0;
  stringstream local_690 [8];
  stringstream ss_2;
  ostream local_680 [381];
  RefEl local_503;
  RefEl local_502;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  stringstream local_420 [8];
  stringstream ss_1;
  ostream local_410 [383];
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *local_18;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry_local;
  MeshFactory *this_local;
  
  local_18 = geometry;
  geometry_local =
       (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)this;
  bVar1 = std::operator==(geometry,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"No creation of a point without a valid geometry");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"geometry != nullptr",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x24,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x24,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  pGVar6 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
           operator->(local_18);
  dVar4 = (*pGVar6->_vptr_Geometry[1])();
  if (dVar4 != this->dim_world_) {
    std::__cxx11::stringstream::stringstream(local_420);
    std::operator<<(local_410,"geometry->DimGlobal() != dim_world_");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"geometry->DimGlobal() == dim_world_",&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_469);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_440,&local_468,0x26,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"false",&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
               ,&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_501);
    lf::base::AssertionFailed(&local_4b0,&local_4d8,0x26,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator(&local_501);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    abort();
  }
  pGVar6 = std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
           operator->(local_18);
  iVar5 = (*pGVar6->_vptr_Geometry[2])();
  local_502.type_ = (RefElType)iVar5;
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_502);
  local_503 = lf::base::RefEl::kPoint();
  RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_503);
  if (RVar2 == RVar3) {
    std::
    vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
    ::
    emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
              ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                *)&this->nodes_,local_18);
    sVar7 = std::
            vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
            ::size(&this->nodes_);
    return (int)sVar7 - 1;
  }
  std::__cxx11::stringstream::stringstream(local_690);
  std::operator<<(local_680,"Geometry object must belong to a point");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"geometry->RefEl() == lf::base::RefEl::kPoint()",&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
             ,&local_6d9);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_6b0,&local_6d8,0x28,&local_700);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator(&local_6b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"false",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
             ,&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"",&local_771);
  lf::base::AssertionFailed(&local_720,&local_748,0x28,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  abort();
}

Assistant:

MeshFactory::size_type MeshFactory::AddPoint(
    std::unique_ptr<geometry::Geometry>&& geometry) {
  // Note: For the sake of purely topological computations meshes without
  // any geometry information may make sense.
  // Moreover, the location of a point can in principle be deduced from
  // geometry information supplied for edges or cells.
  // Hence the next assertion should be removed in the medium run.
  LF_ASSERT_MSG(geometry != nullptr,
                "No creation of a point without a valid geometry");
  LF_ASSERT_MSG(geometry->DimGlobal() == dim_world_,
                "geometry->DimGlobal() != dim_world_");
  LF_ASSERT_MSG(geometry->RefEl() == lf::base::RefEl::kPoint(),
                "Geometry object must belong to a point");
  nodes_.emplace_back(std::move(geometry));
  return nodes_.size() - 1;
}